

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> * __thiscall
flow::convert<flow::util::Cidr,flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>
          (vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *__return_storage_ptr__,
          flow *this,vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  Cidr *pCVar7;
  long lVar8;
  byte bVar9;
  Cidr local_80;
  
  bVar9 = 0;
  std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::vector
            (__return_storage_ptr__,*(long *)(this + 8) - *(long *)this >> 3,
             (allocator_type *)&local_80);
  lVar2 = *(long *)(this + 8);
  lVar3 = *(long *)this;
  lVar5 = 0;
  for (lVar8 = 0; lVar2 - lVar3 >> 3 != lVar8; lVar8 = lVar8 + 1) {
    puVar6 = (undefined8 *)(*(long *)(*(long *)this + lVar8 * 8) + 0x48);
    pCVar7 = &local_80;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *puVar6;
      (pCVar7->ipaddr_).family_ = (int)uVar1;
      (pCVar7->ipaddr_).cstr_[0] = (char)((ulong)uVar1 >> 0x20);
      (pCVar7->ipaddr_).cstr_[1] = (char)((ulong)uVar1 >> 0x28);
      (pCVar7->ipaddr_).cstr_[2] = (char)((ulong)uVar1 >> 0x30);
      (pCVar7->ipaddr_).cstr_[3] = (char)((ulong)uVar1 >> 0x38);
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      pCVar7 = (Cidr *)((long)pCVar7 + (ulong)bVar9 * -0x10 + 8);
    }
    util::Cidr::operator=
              ((Cidr *)((((__return_storage_ptr__->
                          super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>).
                          _M_impl.super__Vector_impl_data._M_start)->ipaddr_).cstr_ + lVar5 + -4),
               &local_80);
    lVar5 = lVar5 + 0x50;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> convert(const std::vector<Constant*>& source) {
  std::vector<T> target(source.size());

  for (size_t i = 0, e = source.size(); i != e; ++i)
    target[i] = static_cast<S*>(source[i])->get();

  return target;
}